

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

mi_heap_t * mi_heap_of_block(void *p)

{
  mi_segment_t *p_00;
  uintptr_t uVar1;
  mi_page_t *page;
  void *in_RDI;
  mi_segment_t *unaff_retaddr;
  _Bool valid;
  mi_segment_t *segment;
  void *in_stack_fffffffffffffff8;
  mi_heap_t *pmVar2;
  
  if (in_RDI == (void *)0x0) {
    pmVar2 = (mi_heap_t *)0x0;
  }
  else {
    p_00 = _mi_ptr_segment(in_RDI);
    uVar1 = _mi_ptr_cookie(p_00);
    if (uVar1 == p_00->cookie) {
      page = _mi_segment_page_of(unaff_retaddr,in_stack_fffffffffffffff8);
      pmVar2 = mi_page_heap(page);
    }
    else {
      pmVar2 = (mi_heap_t *)0x0;
    }
  }
  return pmVar2;
}

Assistant:

static mi_heap_t* mi_heap_of_block(const void* p) {
  if (p == NULL) return NULL;
  mi_segment_t* segment = _mi_ptr_segment(p);
  bool valid = (_mi_ptr_cookie(segment) == segment->cookie);
  mi_assert_internal(valid);
  if mi_unlikely(!valid) return NULL;
  return mi_page_heap(_mi_segment_page_of(segment,p));
}